

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O1

QRgbaFloat<float> *
fetchGrayscale8To<QRgbaFloat<float>>
          (QRgbaFloat<float> *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  ulong uVar2;
  float fVar3;
  
  if (0 < count) {
    pfVar1 = &buffer->b;
    uVar2 = 0;
    do {
      fVar3 = (float)src[uVar2 + (long)index] * 0.003921569;
      ((QRgbaFloat<float> *)(pfVar1 + -2))->r = fVar3;
      pfVar1[-1] = fVar3;
      *pfVar1 = fVar3;
      pfVar1[1] = 1.0;
      uVar2 = uVar2 + 1;
      pfVar1 = pfVar1 + 4;
    } while ((uint)count != uVar2);
  }
  return buffer;
}

Assistant:

static const QRgba *QT_FASTCALL fetchGrayscale8To(QRgba *buffer, const uchar *src, int index, int count,
                                                  const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i) {
        const uint s = src[index + i];
        buffer[i] = QRgba::fromRgba(s, s, s, 255);
    }
    return buffer;
}